

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_x_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  char cVar5;
  uint16_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int16_t *piVar10;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t tmp;
  int k;
  int32_t res;
  int x;
  int y;
  int16_t *x_filter;
  int round_bits;
  int round_offset;
  int offset_bits;
  int bits;
  int fo_horiz;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int val;
  int local_5c;
  int local_58;
  int local_54;
  
  lVar4 = *(long *)(x_filter + 4);
  iVar2 = *(int *)(x_filter + 8);
  uVar1 = _k->taps;
  uVar3 = *(undefined4 *)(x_filter + 0xc);
  cVar5 = ((char)round_bits + '\x0e') - (char)*(undefined4 *)(x_filter + 10);
  iVar7 = (1 << (cVar5 - (char)*(undefined4 *)(x_filter + 0xc) & 0x1fU)) +
          (1 << ((cVar5 - (char)*(undefined4 *)(x_filter + 0xc)) - 1U & 0x1f));
  piVar10 = av1_get_interp_filter_subpel_kernel(_k,x & 0xf);
  for (local_54 = 0; local_54 < in_R9D; local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < in_R8D; local_58 = local_58 + 1) {
      local_5c = 0;
      for (val = 0; val < (int)(uint)_k->taps; val = val + 1) {
        local_5c = (int)piVar10[val] *
                   (uint)*(ushort *)
                          (in_RDI + (long)(int)(((local_54 * in_ESI + local_58) - (uVar1 / 2 - 1)) +
                                               val) * 2) + local_5c;
      }
      iVar8 = iVar7 + (1 << (7U - (char)uVar3 & 0x1f)) *
                      (local_5c + ((1 << ((byte)*(undefined4 *)(x_filter + 10) & 0x1f)) >> 1) >>
                      ((byte)*(undefined4 *)(x_filter + 10) & 0x1f));
      if (*(int *)x_filter == 0) {
        *(short *)(lVar4 + (long)(local_54 * iVar2 + local_58) * 2) = (short)iVar8;
      }
      else {
        uVar9 = (uint)*(ushort *)(lVar4 + (long)(local_54 * iVar2 + local_58) * 2);
        if (*(int *)(x_filter + 0x12) == 0) {
          iVar8 = (int)(iVar8 + uVar9) >> 1;
        }
        else {
          iVar8 = (int)(uVar9 * *(int *)(x_filter + 0x14) + iVar8 * *(int *)(x_filter + 0x16)) >> 4;
        }
        uVar6 = clip_pixel_highbd(val,iVar8 - iVar7);
        *(uint16_t *)(in_RDX + (long)(local_54 * in_ECX + local_58) * 2) = uVar6;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_x,
                                      const int subpel_x_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = (1 << bits) * ROUND_POWER_OF_TWO(res, conv_params->round_0);
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}